

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

void __thiscall testing::internal::DeathTestImpl::~DeathTestImpl(DeathTestImpl *this)

{
  long *plVar1;
  long *plVar2;
  size_type *psVar3;
  int local_e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  string local_80;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  string local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20;
  
  (this->super_DeathTest)._vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_0015f260;
  if (this->read_fd_ == -1) {
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&(this->matcher_).
                    super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  );
    return;
  }
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"CHECK failed: File ","");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_60);
  local_c0 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_c0 == plVar2) {
    local_b0 = *plVar2;
    lStack_a8 = plVar1[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar2;
  }
  local_b8 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_c0);
  local_e0._M_dataplus._M_p = (pointer)*plVar1;
  psVar3 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_e0._M_dataplus._M_p == psVar3) {
    local_e0.field_2._M_allocated_capacity = *psVar3;
    local_e0.field_2._8_8_ = plVar1[3];
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar3;
  }
  local_e0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_e4 = 0x1a2;
  StreamableToString<int>(&local_40,&local_e4);
  std::operator+(&local_20,&local_e0,&local_40);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_20);
  local_a0 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_a0 == plVar2) {
    local_90 = *plVar2;
    lStack_88 = plVar1[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar2;
  }
  local_98 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_a0);
  local_80._M_dataplus._M_p = (pointer)*plVar1;
  psVar3 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_80._M_dataplus._M_p == psVar3) {
    local_80.field_2._M_allocated_capacity = *psVar3;
    local_80.field_2._8_8_ = plVar1[3];
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar3;
  }
  local_80._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  DeathTestAbort(&local_80);
}

Assistant:

~DeathTestImpl() override { GTEST_DEATH_TEST_CHECK_(read_fd_ == -1); }